

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

BOOL __thiscall
Js::CustomExternalWrapperObject::Equals
          (CustomExternalWrapperObject *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  *value = (uint)((CustomExternalWrapperObject *)other == this);
  return 1;
}

Assistant:

BOOL CustomExternalWrapperObject::Equals(__in Var other, __out BOOL* value, ScriptContext* requestContext)
{
    // We need to implement comparison to other by reference in case the object
    // is in the left side of the comparison, and does not call a toString
    // method (like different objects) when compared to string. For Node, such
    // comparision is used for Buffers.
    *value = (other == this);
    return true;
}